

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void ParseBag(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint local_3c;
  WORD mod;
  int i;
  int numbags;
  WORD prev_mod;
  SFBag *bag;
  SFBag *bags;
  DWORD chunklen_local;
  DWORD chunkid_local;
  FileReader *f_local;
  SFFile *sf2_local;
  
  i._2_2_ = 0;
  if ((chunklen & 3) != 0) {
    uVar5 = __cxa_allocate_exception(1);
    __cxa_throw(uVar5,&CBadForm::typeinfo,0);
  }
  local_3c = chunklen >> 2;
  if (chunkid == 0x67616270) {
    if (local_3c != sf2->Presets[sf2->NumPresets + -1].BagIndex + 1) {
      uVar5 = __cxa_allocate_exception(1);
      __cxa_throw(uVar5,&CBadForm::typeinfo,0);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)local_3c;
    uVar6 = SUB168(auVar1 * ZEXT816(0xc),0);
    if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    bag = (SFBag *)operator_new__(uVar6);
    sf2->PresetBags = bag;
    sf2->NumPresetBags = local_3c;
  }
  else {
    if (chunkid != 0x67616269) {
      __assert_fail("chunkid == ID_ibag",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/timidity/instrum_sf2.cpp"
                    ,0x1f8,"void ParseBag(SFFile *, FileReader *, DWORD, DWORD)");
    }
    if (local_3c != sf2->Instruments[sf2->NumInstruments + -1].BagIndex + 1) {
      uVar5 = __cxa_allocate_exception(1);
      __cxa_throw(uVar5,&CBadForm::typeinfo,0);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(int)local_3c;
    uVar6 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    bag = (SFBag *)operator_new__(uVar6);
    sf2->InstrBags = bag;
    sf2->NumInstrBags = local_3c;
  }
  _numbags = bag;
  while( true ) {
    if (local_3c == 0) {
      return;
    }
    iVar3 = read_uword(f);
    _numbags->GenIndex = (WORD)iVar3;
    uVar4 = read_uword(f);
    if ((_numbags != bag) &&
       ((_numbags->GenIndex < _numbags[-1].GenIndex || ((uVar4 & 0xffff) < (uint)i._2_2_)))) break;
    (_numbags->VelRange).Lo = '\0';
    (_numbags->KeyRange).Lo = '\0';
    (_numbags->VelRange).Hi = '\x7f';
    (_numbags->KeyRange).Hi = '\x7f';
    _numbags->Target = -1;
    local_3c = local_3c - 1;
    _numbags = _numbags + 1;
    i._2_2_ = (ushort)uVar4;
  }
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&CBadForm::typeinfo,0);
}

Assistant:

static void ParseBag(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	SFBag *bags, *bag;
	WORD prev_mod = 0;
	int numbags;
	int i;

	// Section 7.3, page 22:
	//		It is always a multiple of four bytes in length, and contains one
	//		record for each preset zone plus one record for a terminal zone. ...
	//		If the PBAG sub-chunk is missing, or its size is not a multiple of
	//		four bytes, the file should be rejected as structurally unsound.
	// Section 7.7: IBAG is the same, but substitute "instrument" for "preset".
	if (chunklen & 3)
	{
		throw CBadForm();
	}

	numbags = chunklen >> 2;

	if (chunkid == ID_pbag)
	{
		if (numbags != sf2->Presets[sf2->NumPresets - 1].BagIndex + 1)
		{
			throw CBadForm();
		}
		sf2->PresetBags = bags = new SFBag[numbags];
		sf2->NumPresetBags = numbags;
	}
	else
	{
		assert(chunkid == ID_ibag);
		if (numbags != sf2->Instruments[sf2->NumInstruments - 1].BagIndex + 1)
		{
			throw CBadForm();
		}
		sf2->InstrBags = bags = new SFBag[numbags];
		sf2->NumInstrBags = numbags;
	}

	for (bag = bags, i = numbags; i != 0; --i, ++bag)
	{
		bag->GenIndex = read_uword(f);
		WORD mod = read_uword(f);
		// Section 7.3, page 22:
		//		If the generator or modulator indices are non-monotonic or do not
		//		match the size of the respective PGEN or PMOD sub-chunks, the file
		//		is structurally defective and should be rejected at load time.
		if (bag != bags)
		{
			if (bag->GenIndex < (bag - 1)->GenIndex || mod < prev_mod)
			{
				throw CBadForm();
			}
		}
		prev_mod = mod;
		bag->KeyRange.Lo = bag->VelRange.Lo = 0;
		bag->KeyRange.Hi = bag->VelRange.Hi = 127;
		bag->Target = -1;
	}
}